

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O1

void __thiscall Minisat::Int64Option::giveRndValue(Int64Option *this,string *optionText)

{
  undefined8 *puVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  long *plVar6;
  undefined8 *puVar7;
  ulong *puVar8;
  ulong uVar9;
  long lVar10;
  ostringstream strs;
  ulong *local_218;
  long local_210;
  ulong local_208;
  long lStack_200;
  undefined8 *local_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  ulong *local_1d8;
  long local_1d0;
  ulong local_1c8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  lVar10 = (this->range).begin;
  iVar5 = rand();
  lVar3 = (this->range).end;
  if (lVar3 < lVar10 + iVar5) {
    lVar4 = (this->range).begin;
    lVar10 = (lVar10 + iVar5) - lVar3;
    do {
      lVar2 = lVar10 + lVar4;
      lVar10 = lVar10 + (lVar4 - lVar3);
    } while (lVar3 < lVar2);
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::ostream::_M_insert<long>((long)local_198);
  std::operator+(&local_1b8,"-",optionText);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_1b8);
  puVar8 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar8) {
    local_208 = *puVar8;
    lStack_200 = plVar6[3];
    local_218 = &local_208;
  }
  else {
    local_208 = *puVar8;
    local_218 = (ulong *)*plVar6;
  }
  local_210 = plVar6[1];
  *plVar6 = (long)puVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::stringbuf::str();
  uVar9 = 0xf;
  if (local_218 != &local_208) {
    uVar9 = local_208;
  }
  if (uVar9 < (ulong)(local_1d0 + local_210)) {
    uVar9 = 0xf;
    if (local_1d8 != local_1c8) {
      uVar9 = local_1c8[0];
    }
    if ((ulong)(local_1d0 + local_210) <= uVar9) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,(ulong)local_218);
      goto LAB_00121059;
    }
  }
  puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_218,(ulong)local_1d8);
LAB_00121059:
  local_1f8 = &local_1e8;
  puVar1 = puVar7 + 2;
  if ((undefined8 *)*puVar7 == puVar1) {
    local_1e8 = *puVar1;
    uStack_1e0 = puVar7[3];
  }
  else {
    local_1e8 = *puVar1;
    local_1f8 = (undefined8 *)*puVar7;
  }
  local_1f0 = puVar7[1];
  *puVar7 = puVar1;
  puVar7[1] = 0;
  *(undefined1 *)puVar1 = 0;
  std::__cxx11::string::operator=((string *)optionText,(string *)&local_1f8);
  if (local_1f8 != &local_1e8) {
    operator_delete(local_1f8);
  }
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void giveRndValue(std::string &optionText)
    {
        int64_t rndV = range.begin;
        rndV += rand();
        while (rndV > range.end) {
            rndV -= range.end - range.begin;
        }
        std::ostringstream strs;
        strs << rndV;
        optionText = "-" + optionText + "=" + strs.str();
    }